

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::fill(CImg<unsigned_int> *this,uint *val)

{
  uint uVar1;
  uint *puVar2;
  bool bVar3;
  ulongT uVar4;
  uint *_maxptrd;
  uint *ptrd;
  uint *val_local;
  CImg<unsigned_int> *this_local;
  
  bVar3 = is_empty(this);
  if (!bVar3) {
    if (*val == 0) {
      puVar2 = this->_data;
      uVar1 = *val;
      uVar4 = size(this);
      memset(puVar2,uVar1 & 0xff,uVar4 << 2);
    }
    else {
      _maxptrd = this->_data;
      puVar2 = this->_data;
      uVar4 = size(this);
      for (; _maxptrd < puVar2 + uVar4; _maxptrd = _maxptrd + 1) {
        *_maxptrd = *val;
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& fill(const T& val) {
      if (is_empty()) return *this;
      if (val && sizeof(T)!=1) cimg_for(*this,ptrd,T) *ptrd = val;
      else std::memset(_data,(int)(ulongT)val,sizeof(T)*size()); // Double cast to allow val to be (void*)
      return *this;
    }